

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::descriptor_unittest::IsGroupLike_GroupLikeNotDelimited_Test::
~IsGroupLike_GroupLikeNotDelimited_Test(IsGroupLike_GroupLikeNotDelimited_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(IsGroupLike, GroupLikeNotDelimited) {
  using internal::cpp::IsGroupLike;
  const Descriptor& msg = *editions_unittest::TestDelimited::descriptor();
  const FileDescriptor& file =
      *editions_unittest::TestDelimited::descriptor()->file();

  EXPECT_EQ(msg.FindFieldByName("lengthprefixed")->type(),
            FieldDescriptor::TYPE_MESSAGE);
  EXPECT_FALSE(IsGroupLike(*msg.FindFieldByName("lengthprefixed")));
  EXPECT_EQ(file.FindExtensionByName("lengthprefixed")->type(),
            FieldDescriptor::TYPE_MESSAGE);
  EXPECT_FALSE(IsGroupLike(*file.FindExtensionByName("lengthprefixed")));
}